

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<CPP::WriteInitialization::Buddy>::reallocateAndGrow
          (QArrayDataPointer<CPP::WriteInitialization::Buddy> *this,GrowthPosition where,qsizetype n
          ,QArrayDataPointer<CPP::WriteInitialization::Buddy> *old)

{
  long lVar1;
  bool bVar2;
  QGenericArrayOps<CPP::WriteInitialization::Buddy> *this_00;
  Buddy *b;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<CPP::WriteInitialization::Buddy> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<CPP::WriteInitialization::Buddy> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  Buddy *in_stack_ffffffffffffff80;
  Buddy *in_stack_ffffffffffffff88;
  QGenericArrayOps<CPP::WriteInitialization::Buddy> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)
                           in_stack_ffffffffffffff80), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)0xaaaaaaaaaaaaaaaa,
                 -0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)
                          in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<CPP::WriteInitialization::Buddy> *)
                  operator->((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)0x15d11c);
        begin((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)0x15d12b);
        QtPrivate::QGenericArrayOps<CPP::WriteInitialization::Buddy>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (Buddy *)operator->((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)
                                 &stack0xffffffffffffffe0);
        b = begin((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)0x15d161);
        begin((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)0x15d170);
        QtPrivate::QGenericArrayOps<CPP::WriteInitialization::Buddy>::moveAppend
                  (in_stack_ffffffffffffff90,b,in_stack_ffffffffffffff80);
      }
    }
    swap((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<CPP::WriteInitialization::Buddy> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<CPP::WriteInitialization::Buddy> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)
                       in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity
              ((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<CPP::WriteInitialization::Buddy> *)in_stack_ffffffffffffff88);
    QtPrivate::QMovableArrayOps<CPP::WriteInitialization::Buddy>::reallocate
              ((QMovableArrayOps<CPP::WriteInitialization::Buddy> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }